

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O2

size_t __thiscall
axl::sl::
BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,false,256ul>>
::
findImpl<axl::sl::BoyerMooreIncrementalAccessorBase<char,false,axl::sl::BoyerMooreStateBase<char>>>
          (BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,false,256ul>>
           *this,BoyerMooreIncrementalAccessorBase<char,_false,_axl::sl::BoyerMooreStateBase<char>_>
                 *accessor,size_t i0,size_t length)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  size_t i;
  long lVar4;
  long lVar5;
  
  i = (i0 + *(long *)(this + 0x10)) - 1;
  lVar5 = *(long *)(this + 0x10) + -1;
  do {
    lVar4 = lVar5;
    if (length <= i) {
      return i - lVar5;
    }
    while (cVar2 = BoyerMooreIncrementalAccessorBase<char,_false,_axl::sl::BoyerMooreStateBase<char>_>
                   ::operator[](accessor,i), cVar2 == *(char *)(*(long *)this + lVar4)) {
      if (lVar4 == 0) {
        return i;
      }
      i = i - 1;
      lVar4 = lVar4 + -1;
    }
    uVar1 = *(ulong *)(*(long *)(this + 0x18) + ((ulong)(long)cVar2 % *(ulong *)(this + 0x28)) * 8);
    uVar3 = *(ulong *)(*(long *)(this + 0x30) + lVar4 * 8);
    if (uVar3 < uVar1) {
      uVar3 = uVar1;
    }
    i = i + uVar3;
  } while( true );
}

Assistant:

size_t
	findImpl(
		const Accessor& accessor,
		size_t i0,
		size_t length
	) const {
		size_t last = m_pattern.getCount() - 1;
		size_t i = i0 + last;
		while (i < length) {
			intptr_t j = last;
			C c;
			for (;;) {
				c = accessor[i];
				if (c != m_pattern[j])
					break;

				if (j == 0)
					return i;

				i--;
				j--;
			}

			i += m_skipTables.getSkip(c, j);
		}

		return i - last; // prospective start of match
	}